

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::executeTestIteration
          (FunctionalTest1_2 *this,_test_case *test_case)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLint GVar6;
  _variable_type _Var7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  GLuint *pGVar10;
  void *xfb_data;
  TestError *this_00;
  bool bVar11;
  FunctionalTest1_2 *this_01;
  long lVar12;
  _variable_type *variable_type;
  GLuint current_subroutine_index;
  string empty_body;
  _variable_type base_variable_type;
  uint n_xfb_varyings;
  string vs_body;
  GLchar *xfb_varyings [1];
  GLuint local_94;
  _variable_type *local_90;
  undefined8 local_88;
  string local_80;
  _variable_type local_60;
  uint local_5c;
  string local_58;
  char *local_38;
  Functions *gl;
  
  this_01 = (FunctionalTest1_2 *)test_case;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  variable_type = &test_case->variable_type;
  getVertexShaderBody_abi_cxx11_(&local_58,this_01,variable_type,test_case->array_size);
  local_38 = "result";
  local_5c = 1;
  pGVar10 = &this->m_po_id;
  bVar2 = Utils::buildProgram(gl,&local_58,&local_80,&local_80,&local_80,&local_80,&local_38,
                              &local_5c,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,
                              (GLuint *)0x0,pGVar10);
  if (bVar2) {
    GVar4 = (*gl->getSubroutineIndex)(*pGVar10,0x8b31,"getter0");
    this->m_po_getter0_subroutine_index = GVar4;
    GVar4 = (*gl->getSubroutineIndex)(this->m_po_id,0x8b31,"getter1");
    this->m_po_getter1_subroutine_index = GVar4;
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glGetSubroutineIndex() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8a1);
    if ((this->m_po_getter0_subroutine_index == 0xffffffff) ||
       (this->m_po_getter1_subroutine_index == 0xffffffff)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"At least one subroutine is considered inactive which is invalid.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x8a5);
    }
    else {
      GVar6 = (*gl->getSubroutineUniformLocation)(*pGVar10,0x8b31,"colorGetterUniform");
      this->m_po_subroutine_uniform_index = GVar6;
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetSubroutineUniformLocation() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8ab);
      if (this->m_po_subroutine_uniform_index != -1) {
        local_90 = variable_type;
        _Var7 = Utils::getBaseVariableType(variable_type);
        local_60 = _Var7;
        uVar8 = Utils::getComponentSizeForVariableType(&local_60);
        uVar9 = Utils::getNumberOfComponentsForVariableType(local_90);
        uVar1 = uVar9 * uVar8 * 4;
        if (_Var7 != VARIABLE_TYPE_BOOL) {
          uVar1 = uVar9 * uVar8;
        }
        (*gl->bufferData)(0x8c8e,(ulong)(uVar1 * 2),(void *)0x0,0x88e4);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x8c2);
        (*gl->useProgram)(*pGVar10);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x8c6);
        local_88._0_4_ = this->m_po_getter0_subroutine_index;
        local_88._4_4_ = this->m_po_getter1_subroutine_index;
        pGVar10 = (GLuint *)&local_88;
        lVar12 = 0;
        bVar2 = true;
        do {
          bVar11 = bVar2;
          local_94 = *pGVar10;
          (*gl->uniformSubroutinesuiv)(0x8b31,1,&local_94);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glUniformSubroutinesuiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x8d2);
          (*gl->bindBufferRange)(0x8c8e,0,this->m_xfb_bo_id,lVar12 * (ulong)uVar1,(ulong)uVar1);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glBindBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x8d7);
          (*gl->beginTransformFeedback)(0);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glBeginTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x8db);
          (*gl->drawArrays)(0,0,1);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glDrawArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x8de);
          (*gl->endTransformFeedback)();
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glEndTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x8e1);
          lVar12 = 1;
          pGVar10 = (GLuint *)((long)&local_88 + 4);
          bVar2 = false;
        } while (bVar11);
        xfb_data = (*gl->mapBuffer)(0x8c8e,35000);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glMapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x8e6);
        bVar2 = verifyXFBData(this,xfb_data,local_90);
        (*gl->unmapBuffer)(0x8c8e);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glUnmapBuffeR() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x8eb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
        return bVar2;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Subroutine uniform is considered inactive which is invalid.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x8af);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Test program failed to build.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x89a);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool FunctionalTest1_2::executeTestIteration(const _test_case& test_case)
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Build the test program */
	std::string		   empty_body;
	std::string		   vs_body		  = getVertexShaderBody(test_case.variable_type, test_case.array_size);
	const glw::GLchar* xfb_varyings[] = { "result" };
	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);

	if (!Utils::buildProgram(gl, vs_body, empty_body, empty_body, empty_body, empty_body, xfb_varyings, n_xfb_varyings,
							 &m_vs_id, NULL, /* out_tc_id */
							 NULL,			 /* out_te_id */
							 NULL,			 /* out_gs_id */
							 NULL, &m_po_id))
	{
		TCU_FAIL("Test program failed to build.");
	}

	/* Retrieve subroutine locations */
	m_po_getter0_subroutine_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "getter0");
	m_po_getter1_subroutine_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "getter1");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

	if (m_po_getter0_subroutine_index == GL_INVALID_INDEX || m_po_getter1_subroutine_index == GL_INVALID_INDEX)
	{
		TCU_FAIL("At least one subroutine is considered inactive which is invalid.");
	}

	/* Retrieve subroutine uniform location */
	m_po_subroutine_uniform_index = gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "colorGetterUniform");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call failed.");

	if (m_po_subroutine_uniform_index == -1)
	{
		TCU_FAIL("Subroutine uniform is considered inactive which is invalid.");
	}

	/* Set up XFB BO storage */
	const Utils::_variable_type base_variable_type	= Utils::getBaseVariableType(test_case.variable_type);
	unsigned int				iteration_xfb_bo_size = Utils::getComponentSizeForVariableType(base_variable_type) *
										 Utils::getNumberOfComponentsForVariableType(test_case.variable_type);
	unsigned int total_xfb_bo_size = 0;

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Boolean varyings are not supported by OpenGL. Instead, we use ints to output
		 * boolean values. */
		iteration_xfb_bo_size = static_cast<unsigned int>(iteration_xfb_bo_size * sizeof(int));
	}

	total_xfb_bo_size = iteration_xfb_bo_size * 2 /* subroutines we will be testing */;

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, total_xfb_bo_size, DE_NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Activate test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Run two iterations. Each iteration should invoke different subroutine. */
	const glw::GLuint  subroutine_indices[] = { m_po_getter0_subroutine_index, m_po_getter1_subroutine_index };
	const unsigned int n_subroutine_indices = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	for (unsigned int n_subroutine_index = 0; n_subroutine_index < n_subroutine_indices; ++n_subroutine_index)
	{
		/* Configure which subroutine should be used for the draw call */
		glw::GLuint current_subroutine_index = subroutine_indices[n_subroutine_index];

		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 1 /* count */, &current_subroutine_index);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");

		/* Update XFB binding so that we do not overwrite data XFBed in previous iterations */
		gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
						   m_xfb_bo_id, iteration_xfb_bo_size * n_subroutine_index, iteration_xfb_bo_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() call failed.");

		/* Draw a single point */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");
	} /* for (all subroutine indices) */

	/* Map the BO storage into process space */
	const void* xfb_data_ptr = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	result &= verifyXFBData(xfb_data_ptr, test_case.variable_type);

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffeR() call failed.");

	return result;
}